

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bgt_32(void)

{
  uint offset_00;
  uint offset;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    if ((((m68ki_cpu.n_flag ^ m68ki_cpu.v_flag) & 0x80) == 0) && (m68ki_cpu.not_z_flag != 0)) {
      m68ki_branch_8(m68ki_cpu.ir & 0xff);
    }
    else {
      m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_bcc_notake_b;
    }
  }
  else if ((((m68ki_cpu.n_flag ^ m68ki_cpu.v_flag) & 0x80) == 0) && (m68ki_cpu.not_z_flag != 0)) {
    offset_00 = m68ki_read_imm_32();
    m68ki_cpu.pc = m68ki_cpu.pc - 4;
    m68ki_branch_32(offset_00);
  }
  else {
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
  }
  return;
}

Assistant:

static void m68k_op_bgt_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		if(COND_GT())
		{
			uint offset = OPER_I_32();
			REG_PC -= 4;
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_32(offset);
			return;
		}
		REG_PC += 4;
		return;
	}
	else
	{
		if(COND_GT())
		{
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_8(MASK_OUT_ABOVE_8(REG_IR));
			return;
		}
		USE_CYCLES(CYC_BCC_NOTAKE_B);
	}
}